

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O3

void __thiscall Kernel::KBO::State::traverse<_1,false>(State *this,KBO *kbo,AppliedTerm tt)

{
  uint uVar1;
  uint64_t uVar2;
  SubstApplicator *pSVar3;
  State *pSVar4;
  int iVar5;
  Term *t;
  State *pSVar6;
  bool bVar7;
  undefined4 extraout_var;
  
  if (((undefined1  [24])tt & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    this->_weightDiff = this->_weightDiff - (kbo->_funcWeights)._specialWeights._variableWeight;
    recordVariable<_1>(this,(uint)(tt.term._content >> 2));
    return;
  }
  if (traverse<-1,false>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState == '\0') {
    traverse<_1,false>();
  }
  if (traverse<-1,_false>::recState._cursor == traverse<-1,_false>::recState._end) {
    Lib::Stack<State>::expand(&traverse<-1,_false>::recState);
  }
  pSVar6 = traverse<-1,_false>::recState._cursor;
  ((traverse<-1,_false>::recState._cursor)->t).applicator = tt.applicator;
  (pSVar6->t).term._content = tt.term._content;
  (pSVar6->t).aboveVar = tt.aboveVar;
  *(undefined7 *)&(pSVar6->t).field_0x9 = tt._9_7_;
  pSVar6->arg = 0;
  traverse<-1,_false>::recState._cursor = traverse<-1,_false>::recState._cursor + 1;
  iVar5 = symbolWeight(kbo,(Term *)tt.term._content);
  this->_weightDiff = this->_weightDiff - iVar5;
  pSVar6 = traverse<-1,_false>::recState._stack;
  if (traverse<-1,_false>::recState._cursor != traverse<-1,_false>::recState._stack) {
    do {
      pSVar4 = traverse<-1,_false>::recState._cursor;
      uVar1 = traverse<-1,_false>::recState._cursor[-1].arg;
      uVar2 = traverse<-1,_false>::recState._cursor[-1].t.term._content;
      if (uVar1 < (*(uint *)(uVar2 + 0xc) & 0xfffffff)) {
        traverse<-1,_false>::recState._cursor[-1].arg = uVar1 + 1;
        t = *(Term **)(uVar2 + 0x28 +
                      ((ulong)(*(uint *)(uVar2 + 0xc) & 0xfffffff) - (long)(int)uVar1) * 8);
        bVar7 = pSVar4[-1].t.aboveVar;
        pSVar3 = pSVar4[-1].t.applicator;
        if (((bVar7 & 1U) != 0) && (((ulong)t & 1) != 0)) {
          iVar5 = (*pSVar3->_vptr_SubstApplicator[2])(pSVar3,(ulong)t >> 2 & 0xffffffff);
          t = (Term *)CONCAT44(extraout_var,iVar5);
          bVar7 = false;
        }
        if (((ulong)t & 1) == 0) {
          iVar5 = symbolWeight(kbo,t);
          this->_weightDiff = this->_weightDiff - iVar5;
          if (traverse<-1,_false>::recState._cursor == traverse<-1,_false>::recState._end) {
            Lib::Stack<State>::expand(&traverse<-1,_false>::recState);
          }
          pSVar6 = traverse<-1,_false>::recState._cursor;
          ((traverse<-1,_false>::recState._cursor)->t).term._content = (uint64_t)t;
          (pSVar6->t).aboveVar = bVar7;
          (pSVar6->t).applicator = pSVar3;
          pSVar6->arg = 0;
          traverse<-1,_false>::recState._cursor = traverse<-1,_false>::recState._cursor + 1;
          pSVar6 = traverse<-1,_false>::recState._stack;
        }
        else {
          this->_weightDiff =
               this->_weightDiff - (kbo->_funcWeights)._specialWeights._variableWeight;
          recordVariable<_1>(this,(uint)((ulong)t >> 2));
          pSVar6 = traverse<-1,_false>::recState._stack;
        }
      }
      else {
        traverse<-1,_false>::recState._cursor = traverse<-1,_false>::recState._cursor + -1;
      }
    } while (traverse<-1,_false>::recState._cursor != pSVar6);
  }
  return;
}

Assistant:

void KBO::State::traverse(KBO const& kbo, AppliedTerm tt)
{
  static_assert(coef==1 || coef==-1);

  if (tt.term.isVar()) {
    if constexpr (!varsOnly) {
      _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
    }
    recordVariable<coef>(tt.term.var());
    return;
  }
  struct State {
    AppliedTerm t;
    unsigned arg;
  };
  static Stack<State> recState;
  recState.push(State{ tt, 0 });

  if constexpr (!varsOnly) {
    _weightDiff += kbo.symbolWeight(tt.term.term()) * coef;
  }

  while (recState.isNonEmpty()) {
    auto& curr = recState.top();
    if (curr.arg >= curr.t.term.term()->arity()) {
      recState.pop();
      continue;
    }
    AppliedTerm t(*curr.t.term.term()->nthArgument(curr.arg++), curr.t);
    if (t.term.isVar()) {
      ASS(!t.aboveVar);
      if constexpr (!varsOnly) {
        _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
      }
      recordVariable<coef>(t.term.var());
      continue;
    }

    if constexpr (varsOnly) {
      if (!t.term.term()->ground()) {
        recState.push(State{ t, 0 });
      }
    } else {
      _weightDiff += kbo.symbolWeight(t.term.term()) * coef;
      recState.push(State{ t, 0 });
    }
  }
}